

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int s_mp_add(mp_int *a,mp_int *b,mp_int *c)

{
  uint uVar1;
  mp_digit *pmVar2;
  mp_digit *pmVar3;
  int iVar4;
  uint uVar5;
  mp_int *pmVar6;
  mp_digit mVar7;
  ulong uVar8;
  uint uVar9;
  mp_digit *pmVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int size;
  
  uVar5 = a->used;
  uVar1 = b->used;
  pmVar6 = b;
  if ((int)uVar1 < (int)uVar5) {
    pmVar6 = a;
  }
  uVar12 = uVar1;
  if ((int)uVar5 < (int)uVar1) {
    uVar12 = uVar5;
  }
  uVar15 = uVar1;
  if ((int)uVar1 < (int)uVar5) {
    uVar15 = uVar5;
  }
  size = uVar15 + 1;
  if ((c->alloc <= (int)uVar15) && (iVar4 = mp_grow(c,size), iVar4 != 0)) {
    return iVar4;
  }
  iVar4 = c->used;
  c->used = size;
  pmVar2 = c->dp;
  if ((int)uVar12 < 1) {
    mVar7 = 0;
    uVar12 = 0;
    pmVar10 = pmVar2;
  }
  else {
    pmVar10 = b->dp;
    uVar9 = uVar5;
    if ((int)uVar1 < (int)uVar5) {
      uVar9 = uVar1;
    }
    pmVar3 = a->dp;
    lVar11 = 0;
    lVar13 = 0;
    mVar7 = 0;
    do {
      uVar14 = mVar7 + pmVar3[lVar13] + pmVar10[lVar13];
      mVar7 = uVar14 >> 0x3c;
      pmVar2[lVar13] = uVar14 & 0xfffffffffffffff;
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + -8;
    } while (uVar9 != (uint)lVar13);
    pmVar10 = (mp_digit *)((long)pmVar2 - lVar11);
  }
  if ((int)uVar12 < (int)uVar15 && uVar1 != uVar5) {
    pmVar3 = pmVar6->dp;
    uVar14 = (ulong)uVar12;
    do {
      uVar8 = mVar7 + pmVar3[uVar14];
      mVar7 = uVar8 >> 0x3c;
      *pmVar10 = uVar8 & 0xfffffffffffffff;
      pmVar10 = pmVar10 + 1;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  *pmVar10 = mVar7;
  if (size < iVar4) {
    memset(pmVar10 + 1,0,(ulong)((iVar4 - uVar15) - 2) * 8 + 8);
  }
  if ((int)uVar15 < 0) {
    if (size != 0) {
      return 0;
    }
  }
  else {
    do {
      uVar5 = uVar15 + 1;
      if (pmVar2[(ulong)uVar5 - 1] != 0) {
        return 0;
      }
      c->used = uVar15;
      uVar15 = uVar15 - 1;
    } while (1 < (int)uVar5);
  }
  c->sign = 0;
  return 0;
}

Assistant:

int s_mp_add (mp_int * a, mp_int * b, mp_int * c)
{
  mp_int *x;
  int     olduse, res, min, max;

  /* find sizes, we let |a| <= |b| which means we have to sort
   * them.  "x" will point to the input with the most digits
   */
  if (a->used > b->used) {
    min = b->used;
    max = a->used;
    x = a;
  } else {
    min = a->used;
    max = b->used;
    x = b;
  }

  /* init result */
  if (c->alloc < max + 1) {
    if ((res = mp_grow (c, max + 1)) != MP_OKAY) {
      return res;
    }
  }

  /* get old used digit count and set new one */
  olduse = c->used;
  c->used = max + 1;

  {
    register mp_digit u, *tmpa, *tmpb, *tmpc;
    register int i;

    /* alias for digit pointers */

    /* first input */
    tmpa = a->dp;

    /* second input */
    tmpb = b->dp;

    /* destination */
    tmpc = c->dp;

    /* zero the carry */
    u = 0;
    for (i = 0; i < min; i++) {
      /* Compute the sum at one digit, T[i] = A[i] + B[i] + U */
      *tmpc = *tmpa++ + *tmpb++ + u;

      /* U = carry bit of T[i] */
      u = *tmpc >> ((mp_digit)DIGIT_BIT);

      /* take away carry bit from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* now copy higher words if any, that is in A+B 
     * if A or B has more digits add those in 
     */
    if (min != max) {
      for (; i < max; i++) {
        /* T[i] = X[i] + U */
        *tmpc = x->dp[i] + u;

        /* U = carry bit of T[i] */
        u = *tmpc >> ((mp_digit)DIGIT_BIT);

        /* take away carry bit from T[i] */
        *tmpc++ &= MP_MASK;
      }
    }

    /* add carry */
    *tmpc++ = u;

    /* clear digits above oldused */
    for (i = c->used; i < olduse; i++) {
      *tmpc++ = 0;
    }
  }

  mp_clamp (c);
  return MP_OKAY;
}